

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void Cmd_addplayerclass(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  PClassPlayerPawn *ti;
  char *pcVar5;
  FPlayerClass newclass;
  FPlayerClass local_50;
  
  if (ParsingKeyConf) {
    iVar2 = FCommandLine::argc(argv);
    if (1 < iVar2) {
      pcVar4 = FCommandLine::operator[](argv,1);
      ti = (PClassPlayerPawn *)PClass::FindActor(pcVar4);
      pcVar4 = FCommandLine::operator[](argv,1);
      bVar1 = ValidatePlayerClass((PClassActor *)ti,pcVar4);
      if (bVar1) {
        local_50.Skins.Array = (int *)0x0;
        local_50.Skins.Most = 0;
        local_50.Skins.Count = 0;
        local_50.Flags = 0;
        iVar2 = 2;
        local_50.Type = ti;
        while( true ) {
          iVar3 = FCommandLine::argc(argv);
          if (iVar3 <= iVar2) break;
          pcVar4 = FCommandLine::operator[](argv,iVar2);
          iVar3 = strcasecmp(pcVar4,"nomenu");
          if (iVar3 == 0) {
            local_50.Flags = local_50.Flags | 1;
          }
          else {
            pcVar4 = FCommandLine::operator[](argv,iVar2);
            pcVar5 = FCommandLine::operator[](argv,1);
            Printf("Unknown flag \'%s\' for player class \'%s\'\n",pcVar4,pcVar5);
          }
          iVar2 = iVar2 + 1;
        }
        TArray<FPlayerClass,_FPlayerClass>::Grow(&PlayerClasses,1);
        FPlayerClass::FPlayerClass(PlayerClasses.Array + PlayerClasses.Count,&local_50);
        PlayerClasses.Count = PlayerClasses.Count + 1;
        TArray<int,_int>::~TArray(&local_50.Skins);
      }
    }
  }
  return;
}

Assistant:

CCMD (addplayerclass)
{
	if (ParsingKeyConf && argv.argc () > 1)
	{
		PClassActor *ti = PClass::FindActor(argv[1]);

		if (ValidatePlayerClass(ti, argv[1]))
		{
			FPlayerClass newclass;

			newclass.Type = static_cast<PClassPlayerPawn *>(ti);
			newclass.Flags = 0;

			int arg = 2;
			while (arg < argv.argc())
			{
				if (!stricmp (argv[arg], "nomenu"))
				{
					newclass.Flags |= PCF_NOMENU;
				}
				else
				{
					Printf ("Unknown flag '%s' for player class '%s'\n", argv[arg], argv[1]);
				}

				arg++;
			}
			PlayerClasses.Push (newclass);
		}
	}
}